

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.cpp
# Opt level: O1

void __thiscall setup::language_entry::load(language_entry *this,istream *is,info *i)

{
  uint32_t uVar1;
  undefined1 *puVar2;
  uint uVar3;
  ulong uVar4;
  codepage_id codepage;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  char buffer [4];
  uint local_2c;
  
  if (0x3ffffff < (i->version).value) {
    util::binary_string::load(is,&this->name);
  }
  util::binary_string::load(is,&this->language_name);
  if ((i->version).value == 0x5050701) {
    util::binary_string::skip(is);
  }
  util::binary_string::load(is,&this->dialog_font);
  util::binary_string::load(is,&this->title_font);
  util::binary_string::load(is,&this->welcome_font);
  util::binary_string::load(is,&this->copyright_font);
  if (0x3ffffff < (i->version).value) {
    util::binary_string::load(is,&this->data);
  }
  if ((i->version).value < 0x4000100) {
    (this->license_text)._M_string_length = 0;
    *(this->license_text)._M_dataplus._M_p = '\0';
    (this->info_before)._M_string_length = 0;
    *(this->info_before)._M_dataplus._M_p = '\0';
    (this->info_after)._M_string_length = 0;
    *(this->info_after)._M_dataplus._M_p = '\0';
  }
  else {
    util::binary_string::load(is,&this->license_text);
    util::binary_string::load(is,&this->info_before);
    util::binary_string::load(is,&this->info_after);
  }
  std::istream::read((char *)is,(long)&local_2c);
  this->language_id = local_2c;
  uVar3 = (i->version).value;
  if (uVar3 < 0x4020200) {
    uVar4 = 0x39;
    puVar2 = (anonymous_namespace)::languages;
    do {
      uVar5 = uVar4 >> 1;
      uVar6 = ~uVar5 + uVar4;
      uVar4 = uVar5;
      if (*(ushort *)((long)puVar2 + uVar5 * 2 * 2) < local_2c) {
        puVar2 = (undefined1 *)((ushort *)((long)puVar2 + uVar5 * 2 * 2) + 2);
        uVar4 = uVar6;
      }
    } while (0 < (long)uVar4);
    uVar3 = 0x4e4;
    if ((puVar2 != &DAT_00158b24) && (local_2c == *(ushort *)puVar2)) {
      uVar3 = (uint)*(ushort *)((long)puVar2 + 2);
    }
    this->codepage = uVar3;
  }
  else if (((i->version).variant._flags.super__Base_bitset<1UL>._M_w & 2) == 0) {
    std::istream::read((char *)is,(long)&local_2c);
    uVar1 = 0x4e4;
    if (local_2c != 0) {
      uVar1 = local_2c;
    }
    this->codepage = uVar1;
  }
  else {
    if (uVar3 < 0x5030000) {
      std::istream::read((char *)is,(long)&local_2c);
    }
    this->codepage = 0x4b0;
  }
  codepage = 0x4b0;
  if ((i->version).value < 0x4020200) {
    codepage = this->codepage;
  }
  sVar7 = 0;
  util::to_utf8(&this->language_name,codepage,(bitset<256UL> *)0x0);
  std::istream::read((char *)is,(long)&local_2c);
  this->dialog_font_size = (ulong)local_2c;
  if ((i->version).value < 0x4010000) {
    std::istream::read((char *)is,(long)&local_2c);
    sVar7 = (size_t)local_2c;
  }
  this->dialog_font_standard_height = sVar7;
  std::istream::read((char *)is,(long)&local_2c);
  this->title_font_size = (ulong)local_2c;
  std::istream::read((char *)is,(long)&local_2c);
  this->welcome_font_size = (ulong)local_2c;
  std::istream::read((char *)is,(long)&local_2c);
  this->copyright_font_size = (ulong)local_2c;
  if ((i->version).value == 0x5050701) {
    std::istream::read((char *)is,(long)&local_2c);
  }
  if ((i->version).value < 0x5020300) {
    this->right_to_left = false;
  }
  else {
    std::istream::read((char *)is,(long)&local_2c);
    this->right_to_left = (char)local_2c != '\0';
  }
  return;
}

Assistant:

void language_entry::load(std::istream & is, const info & i) {
	
	if(i.version >= INNO_VERSION(4, 0, 0)) {
		is >> util::binary_string(name);
	}
	
	is >> util::binary_string(language_name);
	
	if(i.version == INNO_VERSION_EXT(5, 5, 7, 1)) {
		util::binary_string::skip(is);
	}
	
	is >> util::binary_string(dialog_font);
	is >> util::binary_string(title_font);
	is >> util::binary_string(welcome_font);
	is >> util::binary_string(copyright_font);
	
	if(i.version >= INNO_VERSION(4, 0, 0)) {
		is >> util::binary_string(data);
	}
	
	if(i.version >= INNO_VERSION(4, 0, 1)) {
		is >> util::binary_string(license_text);
		is >> util::binary_string(info_before);
		is >> util::binary_string(info_after);
	} else {
		license_text.clear(), info_before.clear(), info_after.clear();
	}
	
	language_id = util::load<boost::uint32_t>(is);
	
	if(i.version < INNO_VERSION(4, 2, 2)) {
		codepage = default_codepage_for_language(language_id);
	} else if(!i.version.is_unicode()) {
		codepage = util::load<boost::uint32_t>(is);
		if(!codepage) {
			codepage = util::cp_windows1252;
		}
	} else {
		if(i.version < INNO_VERSION(5, 3, 0)) {
			(void)util::load<boost::uint32_t>(is);
		}
		codepage = util::cp_utf16le;
	}
	
	if(i.version >= INNO_VERSION(4, 2, 2)) {
		util::to_utf8(language_name, util::cp_utf16le);
	} else {
		util::to_utf8(language_name, codepage);
	}
	
	dialog_font_size = util::load<boost::uint32_t>(is);
	
	if(i.version < INNO_VERSION(4, 1, 0)) {
		dialog_font_standard_height = util::load<boost::uint32_t>(is);
	} else {
		dialog_font_standard_height = 0;
	}
	
	title_font_size = util::load<boost::uint32_t>(is);
	welcome_font_size = util::load<boost::uint32_t>(is);
	copyright_font_size = util::load<boost::uint32_t>(is);
	
	if(i.version == INNO_VERSION_EXT(5, 5, 7, 1)) {
		util::load<boost::uint32_t>(is); // always 8 or 9?
	}
	
	if(i.version >= INNO_VERSION(5, 2, 3)) {
		right_to_left = util::load_bool(is);
	} else {
		right_to_left = false;
	}
	
}